

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QPostEventList::addEvent(QPostEventList *this,QPostEvent *ev)

{
  int iVar1;
  bool bVar2;
  QPostEvent *pQVar3;
  qsizetype qVar4;
  iterator before;
  iterator __val;
  long in_RSI;
  QPostEvent *in_RDI;
  long in_FS_OFFSET;
  int priority;
  iterator at;
  parameter_type in_stack_ffffffffffffff98;
  QList<QPostEvent> *in_stack_ffffffffffffffa8;
  iterator __last;
  iterator in_stack_ffffffffffffffd8;
  const_iterator local_20;
  QPostEvent *local_18;
  QPostEvent *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(in_RSI + 0x10);
  __last.i = in_RDI;
  bVar2 = QList<QPostEvent>::isEmpty((QList<QPostEvent> *)0x555b6b);
  if (!bVar2) {
    pQVar3 = QList<QPostEvent>::constLast(in_stack_ffffffffffffffa8);
    if (pQVar3->priority < iVar1) {
      in_stack_ffffffffffffff98 = *(parameter_type *)&in_RDI[1].priority;
      qVar4 = QList<QPostEvent>::size((QList<QPostEvent> *)in_RDI);
      if ((long)in_stack_ffffffffffffff98 < qVar4) {
        local_10 = (QPostEvent *)&DAT_aaaaaaaaaaaaaaaa;
        local_18 = (QPostEvent *)QList<QPostEvent>::begin((QList<QPostEvent> *)in_RDI);
        before = QList<QPostEvent>::iterator::operator+(in_RDI,(qsizetype)in_stack_ffffffffffffff98)
        ;
        __val = QList<QPostEvent>::end(in_RDI);
        local_10 = (QPostEvent *)
                   std::upper_bound<QList<QPostEvent>::iterator,QPostEvent>
                             (in_stack_ffffffffffffffd8,__last,__val.i);
        QList<QPostEvent>::const_iterator::const_iterator(&local_20,(iterator)local_10);
        QList<QPostEvent>::insert
                  ((QList<QPostEvent> *)in_RDI,(const_iterator)before.i,in_stack_ffffffffffffff98);
        goto LAB_00555c44;
      }
    }
  }
  QList<QPostEvent>::append((QList<QPostEvent> *)in_RDI,in_stack_ffffffffffffff98);
LAB_00555c44:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPostEventList::addEvent(const QPostEvent &ev)
{
    int priority = ev.priority;
    if (isEmpty() ||
            constLast().priority >= priority ||
            insertionOffset >= size()) {
        // optimization: we can simply append if the last event in
        // the queue has higher or equal priority
        append(ev);
    } else {
        // insert event in descending priority order, using upper
        // bound for a given priority (to ensure proper ordering
        // of events with the same priority)
        QPostEventList::iterator at = std::upper_bound(begin() + insertionOffset, end(), ev);
        insert(at, ev);
    }
}